

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

const_iterator __thiscall
chaiscript::Type_Conversions::find(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_> __it;
  Type_Info *local_28;
  Type_Info *local_20;
  
  __it._M_node = *(_Base_ptr *)(this + 0x50);
  local_28 = to;
  local_20 = from;
  while ((__it._M_node != (_Base_ptr)(this + 0x40) &&
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<chaiscript::Type_Conversions::find(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&)const::{lambda(std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&)#1}>
                  ::operator()((_Iter_pred<chaiscript::Type_Conversions::find(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&)const::_lambda(std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&)_1_>
                                *)&local_28,__it), !bVar1))) {
    __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
  }
  return (const_iterator)__it._M_node;
}

Assistant:

std::set<std::shared_ptr<detail::Type_Conversion_Base>>::const_iterator find(const Type_Info &to, const Type_Info &from) const {
      return std::find_if(m_conversions.begin(),
                          m_conversions.end(),
                          [&to, &from](const std::shared_ptr<detail::Type_Conversion_Base> &conversion) {
                            return conversion->to().bare_equal(to) && conversion->from().bare_equal(from);
                          });
    }